

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsecontext.cpp
# Opt level: O2

bool __thiscall FParseContext::FindSym(FParseContext *this,char *sym,FParseSymbol **val)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  FParseSymbol *pFVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(this->symbols).Count;
  pFVar4 = (this->symbols).Array + -1;
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar5 == uVar3) goto LAB_004f0931;
    iVar2 = strcmp(pFVar4[1].Sym,sym);
    pFVar4 = pFVar4 + 1;
    uVar1 = uVar3 + 1;
  } while (iVar2 != 0);
  *val = pFVar4;
LAB_004f0931:
  return uVar3 < uVar5;
}

Assistant:

bool FParseContext::FindSym (char *sym, FParseSymbol **val)
{
	for(unsigned i=0;i<symbols.Size(); i++)
	{
		if (strcmp (symbols[i].Sym, sym) == 0)
		{
			*val = &symbols[i];
			return true;
		}
	}
	return false;
}